

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UBool icu_63::comparePartialLocationKey(UHashTok key1,UHashTok key2)

{
  undefined1 local_31;
  PartialLocationKey *p2;
  PartialLocationKey *p1;
  UHashTok key2_local;
  UHashTok key1_local;
  
  if (key1.pointer == key2.pointer) {
    key1_local._7_1_ = 1;
  }
  else if ((key1.pointer == (void *)0x0) || (key2.pointer == (void *)0x0)) {
    key1_local._7_1_ = 0;
  }
  else {
    local_31 = false;
    if ((*key1.pointer == *key2.pointer) &&
       (local_31 = false, *(long *)((long)key1.pointer + 8) == *(long *)((long)key2.pointer + 8))) {
      local_31 = *(char *)((long)key1.pointer + 0x10) == *(char *)((long)key2.pointer + 0x10);
    }
    key1_local._7_1_ = local_31;
  }
  return key1_local._7_1_;
}

Assistant:

static UBool U_CALLCONV
comparePartialLocationKey(const UHashTok key1, const UHashTok key2) {
    PartialLocationKey *p1 = (PartialLocationKey *)key1.pointer;
    PartialLocationKey *p2 = (PartialLocationKey *)key2.pointer;

    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    // We just check identity of tzID/mzID
    return (p1->tzID == p2->tzID && p1->mzID == p2->mzID && p1->isLong == p2->isLong);
}